

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O1

int64_t av1_estimate_txfm_yrd
                  (AV1_COMP *cpi,MACROBLOCK *x,RD_STATS *rd_stats,int64_t ref_best_rd,BLOCK_SIZE bs,
                  TX_SIZE tx_size)

{
  uint uVar1;
  uint uVar2;
  MB_MODE_INFO *pMVar3;
  MB_MODE_INFO *pMVar4;
  MB_MODE_INFO *pMVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  uint __c;
  uint uVar10;
  int iVar11;
  TX_SIZE TVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  byte bVar16;
  byte bVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  bool bVar21;
  RD_STATS this_rd_stats;
  TXB_CTX txb_ctx;
  rdcost_block_args args;
  TxfmParam txfm_param;
  QUANT_PARAM quant_param;
  long local_1d0;
  int local_1c4;
  long local_1b8;
  int64_t local_148 [2];
  int64_t local_138;
  byte local_130;
  RD_STATS *local_128;
  ulong local_120;
  ENTROPY_CONTEXT *local_118;
  TXB_CTX local_110;
  AV1_COMP *local_108;
  MACROBLOCK *local_100;
  ENTROPY_CONTEXT local_f8 [32];
  ENTROPY_CONTEXT local_d8 [32];
  undefined8 local_b8;
  long lStack_b0;
  int64_t iStack_a8;
  int64_t iStack_a0;
  byte local_98;
  undefined7 uStack_97;
  long local_90;
  int64_t local_88;
  int local_80;
  int local_7c;
  TxfmParam local_70;
  QUANT_PARAM local_58;
  
  pMVar3 = *(x->e_mbd).mi;
  bVar6 = true;
  if ((pMVar3->field_0xa7 & 0x80) == 0) {
    bVar6 = '\0' < pMVar3->ref_frame[0];
  }
  iVar13 = 0;
  if (((x->txfm_search_params).tx_mode_search_type != '\x02') ||
     (uVar14 = (ulong)pMVar3->bsize, iVar13 = 0, uVar14 == 0)) goto LAB_00235da8;
  if (tx_size == '\0') {
    lVar15 = 0;
  }
  else {
    bVar16 = block_size_high[uVar14];
    if (block_size_high[uVar14] < block_size_wide[uVar14]) {
      bVar16 = block_size_wide[uVar14];
    }
    bVar17 = 1;
    if (bVar16 < 0x20) {
      if (bVar16 == 8) {
        TVar12 = '\x01';
        bVar21 = false;
        bVar17 = 0;
      }
      else {
        if (bVar16 == 0x10) {
          TVar12 = '\x02';
          goto LAB_00235d4b;
        }
LAB_00235d59:
        bVar21 = true;
        TVar12 = '\0';
        bVar17 = 1;
      }
    }
    else {
      TVar12 = '\x04';
      bVar21 = false;
      if ((bVar16 != 0x80) && (bVar21 = false, bVar16 != 0x40)) {
        if (bVar16 != 0x20) goto LAB_00235d59;
        TVar12 = '\x03';
LAB_00235d4b:
        bVar21 = false;
      }
    }
    lVar15 = 0x3f;
    if (!bVar21) {
      lVar15 = (ulong)(byte)((bVar17 & ""[tx_size] != TVar12) + TVar12 * -2 + 8) * 3;
    }
    lVar15 = (ulong)(*(x->e_mbd).left_txfm_context <
                    *(byte *)((long)tx_size_high + (ulong)((uint)tx_size * 4))) +
             (ulong)(*(x->e_mbd).above_txfm_context <
                    *(byte *)((long)tx_size_wide + (ulong)((uint)tx_size * 4))) + lVar15;
  }
  iVar13 = (x->mode_costs).txfm_partition_cost[lVar15][0];
LAB_00235da8:
  pMVar4 = (x->e_mbd).left_mbmi;
  pMVar5 = (x->e_mbd).above_mbmi;
  if (pMVar5 == (MB_MODE_INFO *)0x0) {
    uVar10 = 0;
  }
  else {
    uVar10 = (uint)pMVar5->skip_txfm;
  }
  if (pMVar4 == (MB_MODE_INFO *)0x0) {
    uVar19 = 0;
  }
  else {
    uVar19 = (uint)pMVar4->skip_txfm;
  }
  lVar15 = (long)(x->mode_costs).skip_txfm_cost[uVar19 + uVar10][1];
  iVar11 = x->rdmult;
  iVar9 = (x->mode_costs).skip_txfm_cost[uVar19 + uVar10][0] + iVar13;
  pMVar3->tx_size = tx_size;
  uVar10 = (uint)block_size_wide[bs];
  iVar7 = (x->e_mbd).mb_to_right_edge;
  if (iVar7 < 0) {
    uVar10 = (uint)block_size_wide[bs] +
             (iVar7 >> ((char)(x->e_mbd).plane[0].subsampling_x + 3U & 0x1f));
  }
  lVar18 = iVar11 * lVar15 + 0x100 >> 9;
  lVar20 = (long)iVar9 * (long)iVar11 + 0x100 >> 9;
  uVar19 = (uint)block_size_high[bs];
  iVar11 = (x->e_mbd).mb_to_bottom_edge;
  if (iVar11 < 0) {
    uVar19 = (uint)block_size_high[bs] +
             (iVar11 >> ((char)(x->e_mbd).plane[0].subsampling_y + 3U & 0x1f));
  }
  uVar1 = *(uint *)((long)tx_size_wide_unit + (ulong)((uint)tx_size * 4));
  uVar2 = *(uint *)((long)tx_size_high_unit + (ulong)((uint)tx_size * 4));
  local_1d0 = 0x7fffffffffffffff;
  local_128 = rd_stats;
  memset(&local_108,0,0x98);
  local_90 = lVar18;
  if (lVar20 < lVar18) {
    local_90 = lVar20;
  }
  local_b8 = 0;
  lStack_b0 = 0;
  iStack_a8 = 0;
  iStack_a0 = 0;
  local_98 = 1;
  local_108 = cpi;
  local_100 = x;
  local_88 = ref_best_rd;
  av1_get_entropy_contexts(bs,(x->e_mbd).plane,local_f8,local_d8);
  bVar21 = local_7c == 0;
  if (0 < (int)uVar19 >> 2 && bVar21) {
    local_120 = (ulong)(uVar2 & 0xff);
    local_1b8 = 0;
    local_1c4 = 0;
    do {
      if (0 < (int)uVar10 >> 2) {
        lVar18 = 0;
        do {
          local_148[0] = 0;
          local_148[1] = 0;
          local_138 = 0;
          local_130 = 1;
          iVar11 = (int)lVar18;
          if (local_80 == 0) {
            local_118 = local_f8 + lVar18;
            get_txb_ctx(bs,tx_size,0,local_118,local_d8 + local_1b8,&local_110);
            av1_setup_xform(&cpi->common,x,tx_size,'\0',&local_70);
            av1_setup_quant(tx_size,0,1,0,&local_58);
            av1_xform(x,0,local_1c4,(int)local_1b8,iVar11,bs,&local_70);
            av1_quant(x,0,local_1c4,&local_70,&local_58);
            iVar7 = av1_cost_coeffs_txb(x,0,local_1c4,tx_size,local_70.tx_type,&local_110,0);
            dist_block_tx_domain
                      (x,0,local_1c4,tx_size,local_58.qmatrix,
                       av1_scan_orders[local_70.tx_size][local_70.tx_type].scan,local_148,&local_138
                      );
            local_130 = x->plane[0].eobs[local_1c4] == 0 & local_130;
            if (iVar7 == 0x7fffffff || (long)(int)local_b8 == 0x7fffffff) {
              local_b8 = 0x7fffffff;
              lStack_b0 = 0x7fffffffffffffff;
              iStack_a8 = 0x7fffffffffffffff;
              iStack_a0 = 0x7fffffffffffffff;
              local_98 = 0;
            }
            else {
              uVar14 = (long)(int)local_b8 + (long)iVar7;
              if (0x7ffffffe < (long)uVar14) {
                uVar14 = 0x7fffffff;
              }
              local_b8 = CONCAT44(local_b8._4_4_,(int)uVar14);
              if (local_b8._4_4_ == 0) {
                local_b8 = uVar14 & 0xffffffff;
              }
              lStack_b0 = lStack_b0 + local_148[0];
              if (local_138 != 0x7fffffffffffffff && iStack_a0 != 0x7fffffffffffffff) {
                iStack_a0 = iStack_a0 + local_138;
              }
              local_98 = local_98 & local_130;
            }
            lVar8 = local_148[0] * 0x80 + ((long)x->rdmult * (long)iVar7 + 0x100 >> 9);
            lVar20 = local_138 * 0x80;
            if (lVar8 < local_138 * 0x80) {
              lVar20 = lVar8;
            }
            local_90 = lVar20 + local_90;
            bVar21 = local_90 <= ref_best_rd;
            if (ref_best_rd < local_90) {
              local_80 = 1;
            }
            else {
              __c = (uint)x->plane[0].txb_entropy_ctx[local_1c4];
              memset(local_118,__c,(long)(int)uVar1);
              memset(local_d8 + local_1b8,__c,(long)(int)uVar2);
              local_1c4 = local_1c4 + (uVar2 & 0xff) * (uVar1 & 0xff);
            }
          }
          else {
            local_7c = 1;
            bVar21 = false;
          }
        } while ((bVar21) &&
                (lVar18 = lVar18 + (ulong)(uVar1 & 0xff),
                (int)(iVar11 + (uVar1 & 0xff)) < (int)uVar10 >> 2));
      }
      local_1b8 = local_1b8 + local_120;
      bVar21 = local_7c == 0;
    } while (((int)local_1b8 < (int)uVar19 >> 2) && (local_7c == 0));
  }
  if (!bVar21) {
    local_b8 = 0x7fffffff;
    lStack_b0 = 0x7fffffffffffffff;
    iStack_a8 = 0x7fffffffffffffff;
    iStack_a0 = 0x7fffffffffffffff;
    local_98 = 0;
  }
  local_128->rate = (int)local_b8;
  local_128->zero_rate = local_b8._4_4_;
  local_128->dist = lStack_b0;
  *(ulong *)&local_128->skip_txfm = CONCAT71(uStack_97,local_98);
  local_128->rdcost = iStack_a8;
  local_128->sse = iStack_a0;
  iVar11 = local_128->rate;
  if (iVar11 != 0x7fffffff) {
    if ((bool)(local_128->skip_txfm != '\0' & bVar6)) {
      local_1d0 = local_128->sse * 0x80 + (x->rdmult * lVar15 + 0x100 >> 9);
    }
    else {
      local_1d0 = local_128->dist * 0x80 + ((long)x->rdmult * (long)(iVar9 + iVar11) + 0x100 >> 9);
      local_128->rate = iVar13 + iVar11;
    }
    if ((bVar6 && local_128->skip_txfm == '\0') &&
       ((x->e_mbd).lossless[*(ushort *)&pMVar3->field_0xa7 & 7] == 0)) {
      lVar15 = local_128->sse * 0x80 + (x->rdmult * lVar15 + 0x100 >> 9);
      if (lVar15 <= local_1d0) {
        local_128->rate = 0;
        local_128->dist = local_128->sse;
        local_128->skip_txfm = '\x01';
        local_1d0 = lVar15;
      }
    }
  }
  return local_1d0;
}

Assistant:

int64_t av1_estimate_txfm_yrd(const AV1_COMP *const cpi, MACROBLOCK *x,
                              RD_STATS *rd_stats, int64_t ref_best_rd,
                              BLOCK_SIZE bs, TX_SIZE tx_size) {
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const TxfmSearchParams *txfm_params = &x->txfm_search_params;
  const ModeCosts *mode_costs = &x->mode_costs;
  const int is_inter = is_inter_block(mbmi);
  const int tx_select = txfm_params->tx_mode_search_type == TX_MODE_SELECT &&
                        block_signals_txsize(mbmi->bsize);
  int tx_size_rate = 0;
  if (tx_select) {
    const int ctx = txfm_partition_context(
        xd->above_txfm_context, xd->left_txfm_context, mbmi->bsize, tx_size);
    tx_size_rate = mode_costs->txfm_partition_cost[ctx][0];
  }
  const int skip_ctx = av1_get_skip_txfm_context(xd);
  const int no_skip_txfm_rate = mode_costs->skip_txfm_cost[skip_ctx][0];
  const int skip_txfm_rate = mode_costs->skip_txfm_cost[skip_ctx][1];
  const int64_t skip_txfm_rd = RDCOST(x->rdmult, skip_txfm_rate, 0);
  const int64_t no_this_rd =
      RDCOST(x->rdmult, no_skip_txfm_rate + tx_size_rate, 0);
  mbmi->tx_size = tx_size;

  const uint8_t txw_unit = tx_size_wide_unit[tx_size];
  const uint8_t txh_unit = tx_size_high_unit[tx_size];
  const int step = txw_unit * txh_unit;
  const int max_blocks_wide = max_block_wide(xd, bs, 0);
  const int max_blocks_high = max_block_high(xd, bs, 0);

  struct rdcost_block_args args;
  av1_zero(args);
  args.x = x;
  args.cpi = cpi;
  args.best_rd = ref_best_rd;
  args.current_rd = AOMMIN(no_this_rd, skip_txfm_rd);
  av1_init_rd_stats(&args.rd_stats);
  av1_get_entropy_contexts(bs, &xd->plane[0], args.t_above, args.t_left);
  int i = 0;
  for (int blk_row = 0; blk_row < max_blocks_high && !args.incomplete_exit;
       blk_row += txh_unit) {
    for (int blk_col = 0; blk_col < max_blocks_wide; blk_col += txw_unit) {
      RD_STATS this_rd_stats;
      av1_init_rd_stats(&this_rd_stats);

      if (args.exit_early) {
        args.incomplete_exit = 1;
        break;
      }

      ENTROPY_CONTEXT *a = args.t_above + blk_col;
      ENTROPY_CONTEXT *l = args.t_left + blk_row;
      TXB_CTX txb_ctx;
      get_txb_ctx(bs, tx_size, 0, a, l, &txb_ctx);

      TxfmParam txfm_param;
      QUANT_PARAM quant_param;
      av1_setup_xform(&cpi->common, x, tx_size, DCT_DCT, &txfm_param);
      av1_setup_quant(tx_size, 0, AV1_XFORM_QUANT_B, 0, &quant_param);

      av1_xform(x, 0, i, blk_row, blk_col, bs, &txfm_param);
      av1_quant(x, 0, i, &txfm_param, &quant_param);

      this_rd_stats.rate =
          cost_coeffs(x, 0, i, tx_size, txfm_param.tx_type, &txb_ctx, 0);

      const SCAN_ORDER *const scan_order =
          get_scan(txfm_param.tx_size, txfm_param.tx_type);
      dist_block_tx_domain(x, 0, i, tx_size, quant_param.qmatrix,
                           scan_order->scan, &this_rd_stats.dist,
                           &this_rd_stats.sse);

      const int64_t no_skip_txfm_rd =
          RDCOST(x->rdmult, this_rd_stats.rate, this_rd_stats.dist);
      const int64_t skip_rd = RDCOST(x->rdmult, 0, this_rd_stats.sse);

      this_rd_stats.skip_txfm &= !x->plane[0].eobs[i];

      av1_merge_rd_stats(&args.rd_stats, &this_rd_stats);
      args.current_rd += AOMMIN(no_skip_txfm_rd, skip_rd);

      if (args.current_rd > ref_best_rd) {
        args.exit_early = 1;
        break;
      }

      av1_set_txb_context(x, 0, i, tx_size, a, l);
      i += step;
    }
  }

  if (args.incomplete_exit) av1_invalid_rd_stats(&args.rd_stats);

  *rd_stats = args.rd_stats;
  if (rd_stats->rate == INT_MAX) return INT64_MAX;

  int64_t rd;
  // rdstats->rate should include all the rate except skip/non-skip cost as the
  // same is accounted in the caller functions after rd evaluation of all
  // planes. However the decisions should be done after considering the
  // skip/non-skip header cost
  if (rd_stats->skip_txfm && is_inter) {
    rd = RDCOST(x->rdmult, skip_txfm_rate, rd_stats->sse);
  } else {
    // Intra blocks are always signalled as non-skip
    rd = RDCOST(x->rdmult, rd_stats->rate + no_skip_txfm_rate + tx_size_rate,
                rd_stats->dist);
    rd_stats->rate += tx_size_rate;
  }
  // Check if forcing the block to skip transform leads to smaller RD cost.
  if (is_inter && !rd_stats->skip_txfm && !xd->lossless[mbmi->segment_id]) {
    int64_t temp_skip_txfm_rd =
        RDCOST(x->rdmult, skip_txfm_rate, rd_stats->sse);
    if (temp_skip_txfm_rd <= rd) {
      rd = temp_skip_txfm_rd;
      rd_stats->rate = 0;
      rd_stats->dist = rd_stats->sse;
      rd_stats->skip_txfm = 1;
    }
  }

  return rd;
}